

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::string,void>::operator=
          (maybe<std::__cxx11::string,void> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_30 [32];
  
  if (*this == (maybe<std::__cxx11::string,void>)0x1) {
    std::__cxx11::string::string(local_30,(string *)other);
    pbVar1 = value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>
                       ((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)this);
    std::__cxx11::string::swap((string *)pbVar1);
    std::__cxx11::string::~string(local_30);
  }
  else {
    std::__cxx11::string::string((string *)(this + 8),(string *)other);
    *this = (maybe<std::__cxx11::string,void>)0x1;
  }
  return (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }